

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O0

bool __thiscall DTextEnterMenu::MouseEvent(DTextEnterMenu *this,int type,int x,int y)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  float volume;
  FSoundID local_38;
  int local_34;
  int local_30;
  int screen_x;
  int screen_y;
  int cell_height;
  int cell_width;
  int y_local;
  int x_local;
  int type_local;
  DTextEnterMenu *this_local;
  
  screen_y = CleanXfac * 0x12;
  screen_x = CleanYfac * 0xc;
  cell_height = y;
  cell_width = x;
  y_local = type;
  _x_local = this;
  local_30 = DCanvas::GetHeight((DCanvas *)screen);
  local_30 = local_30 + screen_x * -5;
  iVar2 = DCanvas::GetWidth((DCanvas *)screen);
  local_34 = (iVar2 + screen_y * -0xd) / 2;
  if (((cell_width < local_34) || (local_34 + screen_y * 0xd <= cell_width)) ||
     (cell_height < local_30)) {
    this->InputGridY = -1;
    this->InputGridX = -1;
  }
  else {
    this->InputGridX = (cell_width - local_34) / screen_y;
    this->InputGridY = (cell_height - local_30) / screen_x;
    if ((y_local == 2) &&
       (uVar3 = (*(this->super_DMenu).super_DObject._vptr_DObject[8])(this,6,1), (uVar3 & 1) != 0))
    {
      FSoundID::FSoundID(&local_38,"menu/choose");
      volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
      S_Sound(0x22,&local_38,volume,0.0);
      iVar2 = FIntCVar::operator_cast_to_int(&m_use_mouse);
      if (iVar2 == 2) {
        this->InputGridY = -1;
        this->InputGridX = -1;
      }
      return true;
    }
  }
  bVar1 = DMenu::MouseEvent(&this->super_DMenu,y_local,cell_width,cell_height);
  return bVar1;
}

Assistant:

bool DTextEnterMenu::MouseEvent(int type, int x, int y)
{
	const int cell_width = 18 * CleanXfac;
	const int cell_height = 12 * CleanYfac;
	const int screen_y = screen->GetHeight() - INPUTGRID_HEIGHT * cell_height;
	const int screen_x = (screen->GetWidth() - INPUTGRID_WIDTH * cell_width) / 2;

	if (x >= screen_x && x < screen_x + INPUTGRID_WIDTH * cell_width && y >= screen_y)
	{
		InputGridX = (x - screen_x) / cell_width;
		InputGridY = (y - screen_y) / cell_height;
		if (type == DMenu::MOUSE_Release)
		{
			if (MenuEvent(MKEY_Enter, true))
			{
				S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
				if (m_use_mouse == 2) InputGridX = InputGridY = -1;
				return true;
			}
		}
	}
	else
	{
		InputGridX = InputGridY = -1;
	}
	return Super::MouseEvent(type, x, y);
}